

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::api::anon_unknown_1::
createMultipleSharedResourcesTest<vkt::api::(anonymous_namespace)::GraphicsPipeline>
          (TestStatus *__return_storage_ptr__,anon_unknown_1 *this,undefined8 param_3,
          Parameters *param_4)

{
  Parameters *extraout_RDX;
  Unique<vk::Handle<(vk::HandleType)18>_> obj0;
  Unique<vk::Handle<(vk::HandleType)18>_> obj2;
  Unique<vk::Handle<(vk::HandleType)18>_> obj1;
  Unique<vk::Handle<(vk::HandleType)18>_> obj3;
  Environment env;
  Resources res;
  VkPipeline local_1e8;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_1e0;
  Move<vk::Handle<(vk::HandleType)18>_> local_1c8;
  Move<vk::Handle<(vk::HandleType)18>_> local_1a8;
  Move<vk::Handle<(vk::HandleType)18>_> local_188;
  Move<vk::Handle<(vk::HandleType)18>_> local_168;
  Environment local_140;
  Resources local_108;
  
  local_140.vkp = *(PlatformInterface **)(this + 8);
  local_140.vkd = Context::getDeviceInterface((Context *)this);
  local_140.device = Context::getDevice((Context *)this);
  local_140.queueFamilyIndex = Context::getUniversalQueueFamilyIndex((Context *)this);
  local_140.programBinaries = *(BinaryCollection **)(this + 0x10);
  local_140.allocationCallbacks = (VkAllocationCallbacks *)0x0;
  local_140.maxResourceConsumers = 4;
  GraphicsPipeline::Resources::Resources(&local_108,&local_140,extraout_RDX);
  GraphicsPipeline::create(&local_1a8,&local_140,&local_108,param_4);
  DStack_1e0.m_device =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  DStack_1e0.m_allocator =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_1e8.m_internal =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  DStack_1e0.m_deviceIface =
       local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  GraphicsPipeline::create(&local_1c8,&local_140,&local_108,param_4);
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_1c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_1c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_1c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_1c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  GraphicsPipeline::create(&local_188,&local_140,&local_108,param_4);
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_1c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_188.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  GraphicsPipeline::create(&local_168,&local_140,&local_108,param_4);
  local_188.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  local_188.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  if (local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_188.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_168.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (local_1c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_1c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_1c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_1a8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  if (local_1e8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_1e0,local_1e8);
  }
  local_1e8.m_internal = (deUint64)&DStack_1e0.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"Ok","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_1e8.m_internal,
             (undefined1 *)
             ((long)&(DStack_1e0.m_deviceIface)->_vptr_DeviceInterface + local_1e8.m_internal));
  if ((VkDevice *)local_1e8.m_internal != &DStack_1e0.m_device) {
    operator_delete((void *)local_1e8.m_internal,(ulong)(DStack_1e0.m_device + 1));
  }
  GraphicsPipeline::Resources::~Resources(&local_108);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleSharedResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env	(context, 4u);
	const typename Object::Resources	res	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res, params));
	}

	return tcu::TestStatus::pass("Ok");
}